

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset2_Test::
CoinSelection_SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset2_Test
          (CoinSelection_SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset2_Test *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test =
       (_func_int **)
       &PTR__CoinSelection_SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset2_Test_009eefc8;
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_KnapsackSolver_ApproximateBestSubset2)
{
  Amount target_amount = Amount::CreateBySatoshiAmount(460000000);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      target_amount, GetBitcoinUtxoList(), exp_filter, GetBitcoinOption(),
      tx_fee, &select_value, &fee, &use_bnb));

  EXPECT_EQ(ret.size(), 2);
  EXPECT_EQ(select_value.GetSatoshiValue(), 468750000);
  EXPECT_EQ(fee.GetSatoshiValue(), 3600);
  if (ret.size() == 2) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(312500000));
    EXPECT_EQ(ret[1].amount, static_cast<int64_t>(156250000));
  }
  EXPECT_FALSE(use_bnb);
}